

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O2

bool __thiscall
srell::regex_internal::groupname_and_backrefnumber_mapper<char,_unsigned_int>::push_back
          (groupname_and_backrefnumber_mapper<char,_unsigned_int> *this,gname_string *gname,
          uint class_number)

{
  uint uVar1;
  uint local_28;
  uint local_24 [2];
  uint class_number_local;
  
  local_24[0] = class_number;
  uVar1 = operator[](this,gname);
  if (uVar1 == 0xffffffff) {
    simple_array<char>::append(&this->names_,gname);
    _local_28 = CONCAT44(local_24[0],(int)gname->size_);
    simple_array<unsigned_int>::append(&this->keysize_classno_,1,&local_28);
    simple_array<unsigned_int>::append(&this->keysize_classno_,1,local_24);
  }
  return uVar1 == 0xffffffff;
}

Assistant:

bool push_back(const gname_string &gname, const numberT class_number)
	{
		const numberT num = operator[](gname);

		if (num == notfound)
		{
			names_.append(gname);
			keysize_classno_.append(1, static_cast<numberT>(gname.size()));
			keysize_classno_.append(1, class_number);
			return true;
		}
		return false;	//  Already exists.
	}